

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

uint nk_check_flags_label(nk_context *ctx,char *label,uint flags,uint value)

{
  int len;
  uint uVar1;
  
  len = nk_strlen(label);
  uVar1 = nk_check_flags_text(ctx,label,len,flags,value);
  return uVar1;
}

Assistant:

NK_API unsigned int nk_check_flags_label(struct nk_context *ctx, const char *label,
unsigned int flags, unsigned int value)
{
return nk_check_flags_text(ctx, label, nk_strlen(label), flags, value);
}